

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd_file_system.cpp
# Opt level: O0

void __thiscall duckdb::ZstdStreamWrapper::FlushStream(ZstdStreamWrapper *this)

{
  uint uVar1;
  IOException *this_00;
  char *pcVar2;
  pointer puVar3;
  pointer puVar4;
  ZSTD_outBuffer *in_RDI;
  idx_t written_to_output;
  size_t res;
  idx_t output_remaining;
  ZSTD_outBuffer out_buffer;
  ZSTD_inBuffer in_buffer;
  StreamData *sd;
  pointer in_stack_ffffffffffffff40;
  undefined8 in_stack_ffffffffffffff60;
  ZSTD_inBuffer *in_stack_ffffffffffffff68;
  ZSTD_CCtx *in_stack_ffffffffffffff78;
  allocator local_7d [13];
  string local_70 [32];
  size_t local_50;
  pointer local_48;
  undefined8 local_40;
  pointer local_38;
  ZSTD_CCtx *local_30;
  undefined8 local_28;
  undefined8 local_20;
  undefined8 local_18;
  long local_10;
  
  local_10 = in_RDI->size + 0x58;
  local_28 = 0;
  local_20 = 0;
  local_18 = 0;
  do {
    local_48 = std::unique_ptr<unsigned_char[],_std::default_delete<unsigned_char[]>_>::get
                         ((unique_ptr<unsigned_char[],_std::default_delete<unsigned_char[]>_> *)
                          in_stack_ffffffffffffff40);
    local_48 = local_48 + (*(long *)(local_10 + 0x40) - *(long *)(local_10 + 0x18));
    local_40 = *(undefined8 *)(local_10 + 0x18);
    local_30 = (ZSTD_CCtx *)0x0;
    local_38 = local_48;
    local_50 = duckdb_zstd::ZSTD_compressStream2
                         (in_stack_ffffffffffffff78,in_RDI,in_stack_ffffffffffffff68,
                          (ZSTD_EndDirective)((ulong)in_stack_ffffffffffffff60 >> 0x20));
    uVar1 = duckdb_zstd::ZSTD_isError(0x6df169);
    if (uVar1 != 0) {
      this_00 = (IOException *)__cxa_allocate_exception(0x10);
      pcVar2 = duckdb_zstd::ZSTD_getErrorName(0x6df190);
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_70,pcVar2,local_7d);
      duckdb::IOException::IOException(this_00,local_70);
      __cxa_throw(this_00,&IOException::typeinfo,IOException::~IOException);
    }
    *(long *)(local_10 + 0x18) = (long)&local_30->stage + *(long *)(local_10 + 0x18);
    puVar4 = *(pointer *)(local_10 + 0x18);
    in_stack_ffffffffffffff78 = local_30;
    puVar3 = std::unique_ptr<unsigned_char[],_std::default_delete<unsigned_char[]>_>::get
                       ((unique_ptr<unsigned_char[],_std::default_delete<unsigned_char[]>_> *)
                        in_stack_ffffffffffffff40);
    if (puVar3 < puVar4) {
      in_stack_ffffffffffffff40 =
           unique_ptr<duckdb::FileHandle,_std::default_delete<duckdb::FileHandle>,_true>::operator->
                     ((unique_ptr<duckdb::FileHandle,_std::default_delete<duckdb::FileHandle>,_true>
                       *)in_stack_ffffffffffffff40);
      puVar4 = std::unique_ptr<unsigned_char[],_std::default_delete<unsigned_char[]>_>::get
                         ((unique_ptr<unsigned_char[],_std::default_delete<unsigned_char[]>_> *)
                          in_stack_ffffffffffffff40);
      std::unique_ptr<unsigned_char[],_std::default_delete<unsigned_char[]>_>::get
                ((unique_ptr<unsigned_char[],_std::default_delete<unsigned_char[]>_> *)
                 in_stack_ffffffffffffff40);
      duckdb::FileHandle::Write(in_stack_ffffffffffffff40,(ulong)puVar4);
      puVar4 = std::unique_ptr<unsigned_char[],_std::default_delete<unsigned_char[]>_>::get
                         ((unique_ptr<unsigned_char[],_std::default_delete<unsigned_char[]>_> *)
                          in_stack_ffffffffffffff40);
      *(pointer *)(local_10 + 0x18) = puVar4;
    }
  } while (local_50 != 0);
  return;
}

Assistant:

void ZstdStreamWrapper::FlushStream() {
	auto &sd = file->stream_data;
	duckdb_zstd::ZSTD_inBuffer in_buffer;
	duckdb_zstd::ZSTD_outBuffer out_buffer;

	in_buffer.src = nullptr;
	in_buffer.size = 0;
	in_buffer.pos = 0;
	while (true) {
		idx_t output_remaining = (sd.out_buff.get() + sd.out_buf_size) - sd.out_buff_start;

		out_buffer.dst = sd.out_buff_start;
		out_buffer.size = output_remaining;
		out_buffer.pos = 0;

		auto res =
		    duckdb_zstd::ZSTD_compressStream2(zstd_compress_ptr, &out_buffer, &in_buffer, duckdb_zstd::ZSTD_e_end);
		if (duckdb_zstd::ZSTD_isError(res)) {
			throw IOException(duckdb_zstd::ZSTD_getErrorName(res));
		}
		idx_t written_to_output = out_buffer.pos;
		sd.out_buff_start += written_to_output;
		if (sd.out_buff_start > sd.out_buff.get()) {
			file->child_handle->Write(sd.out_buff.get(), sd.out_buff_start - sd.out_buff.get());
			sd.out_buff_start = sd.out_buff.get();
		}
		if (res == 0) {
			break;
		}
	}
}